

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O0

int __thiscall Epoll::create_epool(Epoll *this,int max_fd)

{
  undefined1 auVar1 [16];
  FILE *__stream;
  int iVar2;
  ulong uVar3;
  epoll_event *peVar4;
  int *piVar5;
  char *pcVar6;
  int max_fd_local;
  Epoll *this_local;
  
  this->_maxevents = max_fd;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)max_fd;
  uVar3 = SUB168(auVar1 * ZEXT816(0xc),0);
  if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  peVar4 = (epoll_event *)operator_new__(uVar3);
  this->_events = peVar4;
  iVar2 = epoll_create(max_fd + 1);
  this->_epfd = iVar2;
  __stream = _stderr;
  if (this->_epfd < 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(__stream,"%s(%d)-<%s>: epoll_create failed! error: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Epoll.cpp"
            ,0xe,"create_epool",pcVar6);
    fflush(_stderr);
    exit(1);
  }
  return 0;
}

Assistant:

int Epoll::create_epool(const int max_fd)
{
    _maxevents = max_fd;
    _events = new epoll_event[max_fd];
    _epfd = epoll_create(max_fd+1);
    if (_epfd < 0)
    {
        LOG_PRINT("epoll_create failed! error: %s", strerror(errno));
        exit(EXIT_FAILURE);
    }

    return 0;
}